

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test::
TestBody(RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  RepeatedField<bool> *this_00;
  uint64_t uVar4;
  uint64_t uVar5;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<absl::lts_20250127::Cord> *this_03;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  AssertHelper local_148;
  size_t last_alloc_3;
  AssertionResult gtest_ar;
  size_t last_alloc;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  AssertHelper local_118;
  string buf;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Arena arena;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      buf._M_dataplus._M_p = (pointer)&buf.field_2;
      std::__cxx11::string::_M_construct((ulong)&buf,'\0');
      internal::ThreadSafeArena::ThreadSafeArena
                (&arena.impl_,buf._M_dataplus._M_p,buf._M_string_length);
      this_00 = Arena::DoCreateMessage<google::protobuf::RepeatedField<bool>>(&arena);
      uVar4 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
      iVar7 = 100;
LAB_0074ca2e:
      bVar2 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar2) {
        RepeatedField<bool>::Add(this_00,false);
        uVar5 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
        last_alloc = uVar5 - uVar4;
        if (last_alloc == 0) goto LAB_0074caea;
        last_alloc_3 = CONCAT44(last_alloc_3._4_4_,0x10);
        testing::internal::CmpHelperGE<unsigned_long,int>
                  ((internal *)&gtest_ar,"last_alloc","16",&last_alloc,(int *)&last_alloc_3);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&last_alloc_3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,200,pcVar8);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          bVar6 = 0;
          if (last_alloc != 0) {
            lVar1 = 0x3f;
            if (last_alloc != 0) {
              for (; last_alloc >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            bVar6 = (byte)lVar1 ^ 0x3f;
          }
          last_alloc_3 = CONCAT44(last_alloc_3._4_4_,1 << (~bVar6 & 0x1f));
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&gtest_ar,"(1 << log2)","last_alloc",(int *)&last_alloc_3,
                     &last_alloc);
          if (gtest_ar.success_ != false) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            goto LAB_0074caea;
          }
          testing::Message::Message((Message *)&last_alloc_3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,0xcb,pcVar8);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
        }
        goto LAB_0074cc0a;
      }
LAB_0074cc2c:
      internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
      std::__cxx11::string::~string((string *)&buf);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 == true) goto LAB_0074cc52;
  }
  else {
LAB_0074cc52:
    testing::Message::Message((Message *)&arena);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&buf,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xde,
               "Expected: CheckAllocationSizes<RepeatedField<bool>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&buf,(Message *)&arena);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf);
    if (arena.impl_.tag_and_id_ != 0) {
      (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      buf._M_dataplus._M_p = (pointer)&buf.field_2;
      std::__cxx11::string::_M_construct((ulong)&buf,'\0');
      internal::ThreadSafeArena::ThreadSafeArena
                (&arena.impl_,buf._M_dataplus._M_p,buf._M_string_length);
      this_01 = Arena::DoCreateMessage<google::protobuf::RepeatedField<unsigned_int>>(&arena);
      uVar4 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
      iVar7 = 100;
LAB_0074cd1e:
      bVar2 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar2) {
        RepeatedField<unsigned_int>::Add(this_01,0);
        uVar5 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
        last_alloc = uVar5 - uVar4;
        if (last_alloc == 0) goto LAB_0074cdda;
        last_alloc_3 = CONCAT44(last_alloc_3._4_4_,0x10);
        testing::internal::CmpHelperGE<unsigned_long,int>
                  ((internal *)&gtest_ar,"last_alloc","16",&last_alloc,(int *)&last_alloc_3);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&last_alloc_3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,200,pcVar8);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          bVar6 = 0;
          if (last_alloc != 0) {
            lVar1 = 0x3f;
            if (last_alloc != 0) {
              for (; last_alloc >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            bVar6 = (byte)lVar1 ^ 0x3f;
          }
          last_alloc_3 = CONCAT44(last_alloc_3._4_4_,1 << (~bVar6 & 0x1f));
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&gtest_ar,"(1 << log2)","last_alloc",(int *)&last_alloc_3,
                     &last_alloc);
          if (gtest_ar.success_ != false) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            goto LAB_0074cdda;
          }
          testing::Message::Message((Message *)&last_alloc_3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,0xcb,pcVar8);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
        }
        goto LAB_0074cefe;
      }
LAB_0074cf20:
      internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
      std::__cxx11::string::~string((string *)&buf);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 == true) goto LAB_0074cf46;
  }
  else {
LAB_0074cf46:
    testing::Message::Message((Message *)&arena);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&buf,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xdf,
               "Expected: CheckAllocationSizes<RepeatedField<uint32_t>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&buf,(Message *)&arena);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf);
    if (arena.impl_.tag_and_id_ != 0) {
      (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      buf._M_dataplus._M_p = (pointer)&buf.field_2;
      std::__cxx11::string::_M_construct((ulong)&buf,'\0');
      internal::ThreadSafeArena::ThreadSafeArena
                (&arena.impl_,buf._M_dataplus._M_p,buf._M_string_length);
      this_02 = Arena::DoCreateMessage<google::protobuf::RepeatedField<unsigned_long>>(&arena);
      uVar4 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
      iVar7 = 100;
LAB_0074d012:
      bVar2 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar2) {
        RepeatedField<unsigned_long>::Add(this_02,0);
        uVar5 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
        last_alloc = uVar5 - uVar4;
        if (last_alloc == 0) goto LAB_0074d0ce;
        last_alloc_3 = CONCAT44(last_alloc_3._4_4_,0x10);
        testing::internal::CmpHelperGE<unsigned_long,int>
                  ((internal *)&gtest_ar,"last_alloc","16",&last_alloc,(int *)&last_alloc_3);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&last_alloc_3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,200,pcVar8);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          bVar6 = 0;
          if (last_alloc != 0) {
            lVar1 = 0x3f;
            if (last_alloc != 0) {
              for (; last_alloc >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            bVar6 = (byte)lVar1 ^ 0x3f;
          }
          last_alloc_3 = CONCAT44(last_alloc_3._4_4_,1 << (~bVar6 & 0x1f));
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&gtest_ar,"(1 << log2)","last_alloc",(int *)&last_alloc_3,
                     &last_alloc);
          if (gtest_ar.success_ != false) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            goto LAB_0074d0ce;
          }
          testing::Message::Message((Message *)&last_alloc_3);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,0xcb,pcVar8);
          testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
        }
        goto LAB_0074d1ec;
      }
LAB_0074d20e:
      internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
      std::__cxx11::string::~string((string *)&buf);
    }
    bVar2 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar2 != true) goto LAB_0074d287;
  }
  testing::Message::Message((Message *)&arena);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&buf,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0xe0,
             "Expected: CheckAllocationSizes<RepeatedField<uint64_t>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&buf,(Message *)&arena);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf);
  if (arena.impl_.tag_and_id_ != 0) {
    (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
  }
LAB_0074d287:
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      buf._M_dataplus._M_p = (pointer)&buf.field_2;
      std::__cxx11::string::_M_construct((ulong)&buf,'\0');
      internal::ThreadSafeArena::ThreadSafeArena
                (&arena.impl_,buf._M_dataplus._M_p,buf._M_string_length);
      this_03 = Arena::DoCreateMessage<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                          (&arena);
      uVar4 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
      iVar7 = 100;
LAB_0074d2ff:
      bVar2 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar2) {
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        RepeatedField<absl::lts_20250127::Cord>::Add(this_03,(Cord *)&gtest_ar);
        absl::lts_20250127::Cord::~Cord((Cord *)&gtest_ar);
        uVar5 = internal::ThreadSafeArena::SpaceUsed(&arena.impl_);
        last_alloc_3 = uVar5 - uVar4;
        if (last_alloc_3 == 0) goto LAB_0074d3cf;
        local_148.data_._0_4_ = 0x10;
        testing::internal::CmpHelperGE<unsigned_long,int>
                  ((internal *)&last_alloc,"last_alloc","16",&last_alloc_3,(int *)&local_148);
        if ((char)last_alloc == '\0') {
          testing::Message::Message((Message *)&local_148);
          if (local_120._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = ((local_120._M_head_impl)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,200,pcVar8);
          testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_148);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_120);
          bVar6 = 0;
          if (last_alloc_3 != 0) {
            lVar1 = 0x3f;
            if (last_alloc_3 != 0) {
              for (; last_alloc_3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            bVar6 = (byte)lVar1 ^ 0x3f;
          }
          local_148.data_._0_4_ = 1 << (~bVar6 & 0x1f);
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)&last_alloc,"(1 << log2)","last_alloc",(int *)&local_148,
                     &last_alloc_3);
          if ((char)last_alloc != '\0') {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_120);
            goto LAB_0074d3cf;
          }
          testing::Message::Message((Message *)&local_148);
          if (local_120._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar8 = ((local_120._M_head_impl)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_118,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                     ,0xcb,pcVar8);
          testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_148);
        }
        goto LAB_0074d4f1;
      }
LAB_0074d514:
      internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
      std::__cxx11::string::~string((string *)&buf);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (gtest_fatal_failure_checker.has_new_fatal_failure_ != true) {
      return;
    }
  }
  testing::Message::Message((Message *)&arena);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&buf,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0xe1,
             "Expected: CheckAllocationSizes<RepeatedField<absl::Cord>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&buf,(Message *)&arena);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&buf);
  if (arena.impl_.tag_and_id_ != 0) {
    (**(code **)(*(long *)arena.impl_.tag_and_id_ + 8))();
  }
  return;
LAB_0074caea:
  iVar3 = 3;
  if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    iVar3 = (this_00->soo_rep_).field_0.long_rep.capacity;
  }
  uVar4 = uVar5;
  if (8 < iVar3) {
    last_alloc_3 = CONCAT44(last_alloc_3._4_4_,iVar3) & 0xffffffff00000007;
    local_148.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"capacity_bytes % 8","0",(int *)&last_alloc_3,(int *)&local_148
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&last_alloc_3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar8 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar8 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0xd1,pcVar8);
      testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
LAB_0074cc0a:
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      if (last_alloc_3 != 0) {
        (**(code **)(*(long *)last_alloc_3 + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      goto LAB_0074cc2c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  goto LAB_0074ca2e;
LAB_0074cdda:
  iVar3 = (this_01->soo_rep_).field_0.long_rep.capacity << 2;
  if ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    iVar3 = 8;
  }
  uVar4 = uVar5;
  if (8 < iVar3) {
    last_alloc_3 = CONCAT44(last_alloc_3._4_4_,iVar3) & 0xffffffff00000004;
    local_148.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"capacity_bytes % 8","0",(int *)&last_alloc_3,(int *)&local_148
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&last_alloc_3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar8 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar8 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0xd1,pcVar8);
      testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
LAB_0074cefe:
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      if (last_alloc_3 != 0) {
        (**(code **)(*(long *)last_alloc_3 + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      goto LAB_0074cf20;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  goto LAB_0074cd1e;
LAB_0074d0ce:
  uVar4 = uVar5;
  if (((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) !=
       (undefined1  [16])0x0) && (8 < (this_02->soo_rep_).field_0.long_rep.capacity * 8)) {
    last_alloc_3 = last_alloc_3 & 0xffffffff00000000;
    local_148.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"capacity_bytes % 8","0",(int *)&last_alloc_3,(int *)&local_148
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&last_alloc_3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar8 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar8 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0xd1,pcVar8);
      testing::internal::AssertHelper::operator=(&local_148,(Message *)&last_alloc_3);
LAB_0074d1ec:
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      if (last_alloc_3 != 0) {
        (**(code **)(*(long *)last_alloc_3 + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      goto LAB_0074d20e;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  goto LAB_0074d012;
LAB_0074d3cf:
  uVar4 = uVar5;
  if (((undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4) !=
       (undefined1  [16])0x0) && (8 < (this_03->soo_rep_).field_0.long_rep.capacity * 0x10)) {
    local_148.data_._0_4_ = 0;
    local_118.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&last_alloc,"capacity_bytes % 8","0",(int *)&local_148,(int *)&local_118)
    ;
    if ((char)last_alloc == '\0') {
      testing::Message::Message((Message *)&local_148);
      if (local_120._M_head_impl ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar8 = ((local_120._M_head_impl)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                 ,0xd1,pcVar8);
      testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_148);
LAB_0074d4f1:
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      if ((long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_120);
      goto LAB_0074d514;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_120);
  }
  goto LAB_0074d2ff;
}

Assistant:

TEST(RepeatedField, ArenaAllocationSizesMatchExpectedValues) {
  // RepeatedField guarantees that in 64-bit mode we never allocate anything
  // smaller than 16 bytes from an arena.
  // This is important to avoid a branch in the reallocation path.
  // This is also important because allocating anything less would be wasting
  // memory.
  // If the allocation size is wrong, ReturnArrayMemory will ABSL_DCHECK.
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<bool>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<uint32_t>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<uint64_t>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<absl::Cord>>());
}